

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

value_type
pugi::impl::anon_unknown_0::utf32_decoder<pugi::impl::(anonymous_namespace)::opt_true>::
process<pugi::impl::(anonymous_namespace)::utf8_counter>
          (uint32_t *param_1,long param_2,value_type param_3)

{
  uint32_t ch;
  uint32_t lead;
  value_type local_20;
  long local_18;
  uint32_t *local_10;
  
  local_20 = param_3;
  local_10 = param_1;
  for (local_18 = param_2; local_18 != 0; local_18 = local_18 + -1) {
    ch = endian_swap(*local_10);
    if (ch < 0x10000) {
      local_20 = utf8_counter::low(local_20,ch);
    }
    else {
      local_20 = utf8_counter::high(local_20,ch);
    }
    local_10 = local_10 + 1;
  }
  return local_20;
}

Assistant:

static inline typename Traits::value_type process(const uint32_t* data, size_t size, typename Traits::value_type result, Traits)
		{
			while (size)
			{
				uint32_t lead = opt_swap::value ? endian_swap(*data) : *data;

				// U+0000..U+FFFF
				if (lead < 0x10000)
				{
					result = Traits::low(result, lead);
					data += 1;
					size -= 1;
				}
				// U+10000..U+10FFFF
				else
				{
					result = Traits::high(result, lead);
					data += 1;
					size -= 1;
				}
			}

			return result;
		}